

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

pid_t absl::lts_20250127::base_internal::GetCachedTID(void)

{
  long in_FS_OFFSET;
  
  if (*(char *)(in_FS_OFFSET + -0xc) == '\0') {
    GetCachedTID();
  }
  return *(pid_t *)(in_FS_OFFSET + -0x10);
}

Assistant:

pid_t GetCachedTID() {
#ifdef ABSL_HAVE_THREAD_LOCAL
  static thread_local pid_t thread_id = GetTID();
  return thread_id;
#else
  return GetTID();
#endif  // ABSL_HAVE_THREAD_LOCAL
}